

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_auth_cram_resp(connectdata *conn,int pop3code,pop3state instate)

{
  size_t local_50;
  size_t len;
  char *rplyb64;
  char *chlg64;
  char *chlg;
  SessionHandle *data;
  pop3state local_20;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  chlg = (char *)conn->data;
  chlg64 = (char *)0x0;
  rplyb64 = (char *)0x0;
  len = 0;
  local_50 = 0;
  local_20 = instate;
  result = pop3code;
  _instate_local = conn;
  if (pop3code == 0x2b) {
    pop3_get_message((((SessionHandle *)chlg)->state).buffer,&rplyb64);
    data._4_4_ = Curl_sasl_decode_cram_md5_message(rplyb64,&chlg64,&local_50);
    if (data._4_4_ == CURLE_OK) {
      data._4_4_ = Curl_sasl_create_cram_md5_message
                             ((SessionHandle *)chlg,chlg64,_instate_local->user,
                              _instate_local->passwd,(char **)&len,&local_50);
      if (((data._4_4_ == CURLE_OK) && (len != 0)) &&
         (data._4_4_ = Curl_pp_sendf(&(_instate_local->proto).ftpc.pp,"%s",len),
         data._4_4_ == CURLE_OK)) {
        state(_instate_local,POP3_AUTH_FINAL);
      }
    }
    else {
      data._4_4_ = Curl_pp_sendf(&(_instate_local->proto).ftpc.pp,"%s","*");
      if (data._4_4_ == CURLE_OK) {
        state(_instate_local,POP3_AUTH_CANCEL);
      }
    }
    if (chlg64 != (char *)0x0) {
      (*Curl_cfree)(chlg64);
      chlg64 = (char *)0x0;
    }
    if (len != 0) {
      (*Curl_cfree)((void *)len);
    }
    conn_local._4_4_ = data._4_4_;
  }
  else {
    Curl_failf((SessionHandle *)chlg,"Access denied: %d",(ulong)(uint)pop3code);
    conn_local._4_4_ = CURLE_LOGIN_DENIED;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_state_auth_cram_resp(struct connectdata *conn,
                                          int pop3code,
                                          pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  char *chlg = NULL;
  char *chlg64 = NULL;
  char *rplyb64 = NULL;
  size_t len = 0;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Access denied: %d", pop3code);
    return CURLE_LOGIN_DENIED;
  }

  /* Get the challenge message */
  pop3_get_message(data->state.buffer, &chlg64);

  /* Decode the challenge message */
  result = Curl_sasl_decode_cram_md5_message(chlg64, &chlg, &len);
  if(result) {
    /* Send the cancellation */
    result = Curl_pp_sendf(&conn->proto.pop3c.pp, "%s", "*");

    if(!result)
      state(conn, POP3_AUTH_CANCEL);
  }
  else {
    /* Create the response message */
    result = Curl_sasl_create_cram_md5_message(data, chlg, conn->user,
                                               conn->passwd, &rplyb64, &len);
    if(!result && rplyb64) {
      /* Send the response */
      result = Curl_pp_sendf(&conn->proto.pop3c.pp, "%s", rplyb64);

      if(!result)
        state(conn, POP3_AUTH_FINAL);
    }
  }

  Curl_safefree(chlg);
  Curl_safefree(rplyb64);

  return result;
}